

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

Value * __thiscall json::Value::setString(Value *this,char *s)

{
  IString local_28;
  char *local_18;
  char *s_local;
  Value *this_local;
  
  local_18 = s;
  s_local = (char *)this;
  free(this,s);
  this->type = String;
  wasm::IString::IString(&local_28,local_18);
  wasm::IString::operator=(&(this->field_1).str,&local_28);
  return this;
}

Assistant:

Value& setString(const char* s) {
    free();
    type = String;
    str = s;
    return *this;
  }